

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::TestEventListeners::SetDefaultResultPrinter
          (TestEventListeners *this,TestEventListener *listener)

{
  long lVar1;
  TestEventListener *pTVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar2 = this->default_result_printer_;
  if (pTVar2 != listener) {
    this->default_result_printer_ = (TestEventListener *)0x0;
    pTVar2 = internal::TestEventRepeater::Release(this->repeater_,pTVar2);
    if (pTVar2 != (TestEventListener *)0x0) {
      (*pTVar2->_vptr_TestEventListener[1])(pTVar2);
    }
    this->default_result_printer_ = listener;
    if (listener != (TestEventListener *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        internal::TestEventRepeater::Append(this->repeater_,listener);
        return;
      }
      goto LAB_00154975;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00154975:
  __stack_chk_fail();
}

Assistant:

void TestEventListeners::SetDefaultResultPrinter(TestEventListener* listener) {
  if (default_result_printer_ != listener) {
    // It is an error to pass this method a listener that is already in the
    // list.
    delete Release(default_result_printer_);
    default_result_printer_ = listener;
    if (listener != NULL)
      Append(listener);
  }
}